

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_error(lua_State *L)

{
  int32_t level;
  TValue *pTVar1;
  
  level = 1;
  if ((L->base + 1 < L->top) && (*(int *)((long)L->base + 0xc) != -1)) {
    level = lj_lib_checkint(L,2);
  }
  lua_settop(L,1);
  pTVar1 = L->base;
  if (L->top <= pTVar1) {
    pTVar1 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
  }
  if (0 < level && ((pTVar1->field_2).it < 0xffff0000 || (pTVar1->field_2).it == 0xfffffffb)) {
    luaL_where(L,level);
    lua_pushvalue(L,1);
    lua_concat(L,2);
  }
  lj_err_run(L);
}

Assistant:

LJLIB_CF(error)
{
  int32_t level = lj_lib_optint(L, 2, 1);
  lua_settop(L, 1);
  if (lua_isstring(L, 1) && level > 0) {
    luaL_where(L, level);
    lua_pushvalue(L, 1);
    lua_concat(L, 2);
  }
  return lua_error(L);
}